

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marray.hxx
# Opt level: O1

void __thiscall
andres::Marray<float,std::allocator<unsigned_long>>::Marray<unsigned_long*>
          (Marray<float,std::allocator<unsigned_long>> *this,unsigned_long *begin,unsigned_long *end
          ,float *value,CoordinateOrder *coordinateOrder,allocator_type *allocator)

{
  long lVar1;
  unsigned_long *puVar2;
  float *data;
  runtime_error *this_00;
  size_type sVar3;
  size_type __n;
  
  *(undefined8 *)this = 0;
  *(undefined8 *)(this + 0x10) = 0;
  *(undefined8 *)(this + 0x18) = 0;
  *(undefined8 *)(this + 0x20) = 0;
  *(undefined8 *)(this + 0x28) = 0;
  *(undefined8 *)(this + 0x30) = 0;
  *(undefined4 *)(this + 0x38) = 1;
  this[0x3c] = (Marray<float,std::allocator<unsigned_long>>)0x1;
  View<float,_false,_std::allocator<unsigned_long>_>::testInvariant
            ((View<float,_false,_std::allocator<unsigned_long>_> *)this);
  __n = 1;
  puVar2 = begin;
  if (begin != end) {
    do {
      __n = __n * *puVar2;
      puVar2 = puVar2 + 1;
    } while (puVar2 != end);
  }
  if (__n == 0) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,"Assertion failed.");
  }
  else {
    data = __gnu_cxx::new_allocator<float>::allocate
                     ((new_allocator<float> *)(this + 0x40),__n,(void *)0x0);
    View<float,false,std::allocator<unsigned_long>>::assign<unsigned_long*>
              ((View<float,false,std::allocator<unsigned_long>> *)this,begin,end,data,
               coordinateOrder,coordinateOrder,allocator);
    lVar1 = *(long *)this;
    sVar3 = 0;
    do {
      *(float *)(lVar1 + sVar3 * 4) = *value;
      sVar3 = sVar3 + 1;
    } while (__n != sVar3);
    View<float,_false,_std::allocator<unsigned_long>_>::testInvariant
              ((View<float,_false,_std::allocator<unsigned_long>_> *)this);
    if (this[0x3c] != (Marray<float,std::allocator<unsigned_long>>)0x0) {
      return;
    }
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,"Assertion failed.");
  }
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

inline
Marray<T, A>::Marray
(
    ShapeIterator begin,
    ShapeIterator end,
    const T& value,
    const CoordinateOrder& coordinateOrder,
    const allocator_type& allocator
)
: dataAllocator_(allocator)
{
    std::size_t size = std::accumulate(begin, end, static_cast<std::size_t>(1), 
        std::multiplies<std::size_t>());
    marray_detail::Assert(MARRAY_NO_ARG_TEST || size != 0);
    base::assign(begin, end, dataAllocator_.allocate(size), coordinateOrder, 
        coordinateOrder, allocator); 
    for(std::size_t j=0; j<size; ++j) {
        this->data_[j] = value;
    }
    testInvariant();
}